

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

void __thiscall CTcCodeStream::~CTcCodeStream(CTcCodeStream *this)

{
  ulong uVar1;
  
  (this->super_CTcDataStream)._vptr_CTcDataStream = (_func_int **)&PTR__CTcCodeStream_003586a0;
  release_labels(this);
  if (this->line_pages_alloc_ != 0) {
    uVar1 = 0;
    do {
      free(this->line_pages_[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->line_pages_alloc_);
  }
  free(this->line_pages_);
  CTcDataStream::~CTcDataStream(&this->super_CTcDataStream);
  return;
}

Assistant:

CTcCodeStream::~CTcCodeStream()
{
    size_t i;

    /* release all active labels */
    release_labels();

    /* delete the line records pages */
    for (i = 0 ; i < line_pages_alloc_ ; ++i)
        t3free(line_pages_[i]);

    /* delete the master list of pages */
    t3free(line_pages_);
}